

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void P_PoisonDamage(player_t *player,AActor *source,int damage,bool playPainSound)

{
  APlayerPawn *pAVar1;
  uint uVar2;
  int iVar3;
  AInventory *pAVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  FName local_48;
  FName local_44;
  FState *local_40;
  FState *painstate;
  FName local_30;
  TFlags<ActorFlag2,_unsigned_int> local_2c;
  APlayerPawn *local_28;
  AActor *target;
  bool playPainSound_local;
  AActor *pAStack_18;
  int damage_local;
  AActor *source_local;
  player_t *player_local;
  
  if (player == (player_t *)0x0) {
    return;
  }
  local_28 = player->mo;
  if ((local_28->super_AActor).health < 1) {
    return;
  }
  target._3_1_ = playPainSound;
  target._4_4_ = damage;
  pAStack_18 = source;
  source_local = (AActor *)player;
  if (damage < 1000000) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_2c,(int)local_28 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    bVar5 = true;
    if ((uVar2 == 0) && (bVar5 = true, ((source_local->RenderStyle).AsDWORD & 2) == 0))
    goto LAB_0065a9d4;
  }
  else {
LAB_0065a9d4:
    bVar5 = ((source_local->RenderStyle).AsDWORD & 0x2000000) != 0;
  }
  if (bVar5) {
    return;
  }
  dVar6 = (double)(int)target._4_4_;
  dVar7 = G_SkillProperty(SKILLP_DamageFactor);
  target._4_4_ = (uint)(dVar6 * dVar7);
  bVar5 = TObjPtr<AInventory>::operator!=(&(local_28->super_AActor).Inventory,(AInventory *)0x0);
  if (bVar5) {
    pAVar4 = TObjPtr<AInventory>::operator->(&(local_28->super_AActor).Inventory);
    uVar2 = target._4_4_;
    FName::FName(&local_30,(FName *)((long)&source_local->subsector + 4));
    (*(pAVar4->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3c])
              (pAVar4,(ulong)uVar2,&local_30,(long)&target + 4,1);
  }
  pAVar1 = local_28;
  FName::FName((FName *)((long)&painstate + 4),(FName *)((long)&source_local->subsector + 4));
  target._4_4_ = AActor::ApplyDamageFactor
                           (&pAVar1->super_AActor,(FName *)((long)&painstate + 4),target._4_4_);
  if ((int)target._4_4_ < 1) {
    return;
  }
  if ((*(int *)&(source_local->Angles).Roll.Degrees <= (int)target._4_4_) &&
     (((iVar3 = G_SkillProperty(SKILLP_AutoUseHealth), iVar3 != 0 ||
       (iVar3 = FIntCVar::operator_cast_to_int(&deathmatch), iVar3 != 0)) &&
      ((source_local->floorpic).texnum == 0)))) {
    P_AutoUseHealth((player_t *)source_local,
                    (target._4_4_ - *(int *)&(source_local->Angles).Roll.Degrees) + 1);
  }
  *(uint *)&(source_local->Angles).Roll.Degrees =
       *(int *)&(source_local->Angles).Roll.Degrees - target._4_4_;
  if ((*(int *)&(source_local->Angles).Roll.Degrees < 0x32) &&
     (iVar3 = FIntCVar::operator_cast_to_int(&deathmatch), iVar3 == 0)) {
    P_AutoUseStrifeHealth((player_t *)source_local);
  }
  if (*(int *)&(source_local->Angles).Roll.Degrees < 0) {
    *(undefined4 *)&(source_local->Angles).Roll.Degrees = 0;
  }
  TObjPtr<AActor>::operator=((TObjPtr<AActor> *)&source_local->dropoffz,pAStack_18);
  (local_28->super_AActor).health = (local_28->super_AActor).health - target._4_4_;
  if (0 < (local_28->super_AActor).health) goto LAB_0065acd0;
  if (((source_local->RenderStyle).AsDWORD & 0x8000000) == 0) {
    TFlags<ActorFlag7,_unsigned_int>::operator&
              ((TFlags<ActorFlag7,_unsigned_int> *)&painstate,
               (int)(source_local->super_DThinker).super_DObject._vptr_DObject +
               (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&painstate);
    if (uVar2 != 0) goto LAB_0065abe5;
LAB_0065abf3:
    bVar5 = ((source_local->RenderStyle).AsDWORD & 0x1000000) != 0;
  }
  else {
LAB_0065abe5:
    bVar5 = true;
    if (999999 < (int)target._4_4_) goto LAB_0065abf3;
  }
  if (!bVar5) {
    (local_28->super_AActor).special1 = target._4_4_;
    if ((source_local != (AActor *)0x0) && ((source_local->floorpic).texnum == 0)) {
      bVar5 = FName::operator==((FName *)((long)&source_local->subsector + 4),NAME_Fire);
      if ((bVar5) && ((-0x32 < (local_28->super_AActor).health && (0x19 < (int)target._4_4_)))) {
        FNameNoInit::operator=(&(local_28->super_AActor).DamageType,NAME_Fire);
      }
      else {
        FNameNoInit::operator=
                  (&(local_28->super_AActor).DamageType,
                   (FName *)((long)&source_local->subsector + 4));
      }
    }
    (*(local_28->super_AActor).super_DThinker.super_DObject._vptr_DObject[0xf])
              (local_28,pAStack_18,pAStack_18,0);
    return;
  }
  (local_28->super_AActor).health = 1;
  *(undefined4 *)&(source_local->Angles).Roll.Degrees = 1;
LAB_0065acd0:
  pAVar1 = local_28;
  if (((level.time & 0x3fU) == 0) && ((target._3_1_ & 1) != 0)) {
    FName::FName(&local_44,NAME_Pain);
    FName::FName(&local_48,(FName *)&source_local->floorz);
    local_40 = AActor::FindState(&pAVar1->super_AActor,&local_44,&local_48,false);
    if (local_40 != (FState *)0x0) {
      AActor::SetState(&local_28->super_AActor,local_40,false);
    }
  }
  return;
}

Assistant:

void P_PoisonDamage (player_t *player, AActor *source, int damage,
	bool playPainSound)
{
	AActor *target;

	if (player == NULL)
	{
		return;
	}
	target = player->mo;
	if (target->health <= 0)
	{
		return;
	}
	if ((damage < TELEFRAG_DAMAGE && ((target->flags2 & MF2_INVULNERABLE) ||
		(player->cheats & CF_GODMODE))) || (player->cheats & CF_GODMODE2))
	{ // target is invulnerable
		return;
	}
	// Take half damage in trainer mode
	damage = int(damage * G_SkillProperty(SKILLP_DamageFactor));
	// Handle passive damage modifiers (e.g. PowerProtection)
	if (target->Inventory != NULL)
	{
		target->Inventory->ModifyDamage(damage, player->poisontype, damage, true);
	}
	// Modify with damage factors
	damage = target->ApplyDamageFactor(player->poisontype, damage);

	if (damage <= 0)
	{ // Damage was reduced to 0, so don't bother further.
		return;
	}
	if (damage >= player->health
		&& (G_SkillProperty(SKILLP_AutoUseHealth) || deathmatch)
		&& !player->morphTics)
	{ // Try to use some inventory health
		P_AutoUseHealth(player, damage - player->health+1);
	}
	player->health -= damage; // mirror mobj health here for Dave
	if (player->health < 50 && !deathmatch)
	{
		P_AutoUseStrifeHealth(player);
	}
	if (player->health < 0)
	{
		player->health = 0;
	}
	player->attacker = source;

	//
	// do the damage
	//
	target->health -= damage;
	if (target->health <= 0)
	{ // Death
		if ((((player->cheats & CF_BUDDHA) || (player->mo->flags7 & MF7_BUDDHA)) && damage < TELEFRAG_DAMAGE) || (player->cheats & CF_BUDDHA2))
		{ // [SP] Save the player... 
			player->health = target->health = 1;
		}
		else
		{
			target->special1 = damage;
			if (player && !player->morphTics)
			{ // Check for flame death
				if ((player->poisontype == NAME_Fire) && (target->health > -50) && (damage > 25))
				{
					target->DamageType = NAME_Fire;
				}
				else
				{
					target->DamageType = player->poisontype;
				}
			}
			target->Die(source, source);
			return;
		}
	}
	if (!(level.time&63) && playPainSound)
	{
		FState *painstate = target->FindState(NAME_Pain, player->poisonpaintype);
		if (painstate != NULL)
		{
			target->SetState(painstate);
		}
	}
/*
	if((P_Random() < target->info->painchance)
		&& !(target->flags&MF_SKULLFLY))
	{
		target->flags |= MF_JUSTHIT; // fight back!
		P_SetMobjState(target, target->info->painstate);
	}
*/
}